

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

void test_schema(void)

{
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  undefined1 local_1e0 [8];
  JSON good;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  JSON c;
  string local_168;
  allocator<char> local_141;
  string local_140;
  undefined1 local_120 [8];
  JSON bad_schema;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  JSON b;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  JSON a;
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [8];
  JSON schema;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "\n{\n  \"one\": {\n    \"a\": {\n      \"q\": \"queue\",\n      \"r\": {\n        \"x\": \"ecks\"\n      },\n      \"s\": [\n        {\n          \"ss\": \"esses\"\n        }\n      ]\n    }\n  },\n  \"two\": [\n    {\n      \"goose\": \"gander\",\n      \"glarp\": \"enspliel\"\n    }\n  ],\n  \"three\": {\n    \"<objid>\": {\n      \"z\": \"ebra\",\n      \"o\": \"ptional\"\n    }\n  },\n  \"four\": [\n    { \"first\": \"first element\" },\n    { \"second\": \"second element\" }\n  ]\n}\n"
             ,&local_39);
  JSON::parse((JSON *)local_18,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"[\"not a\", \"dictionary\"]",&local_81);
  JSON::parse((JSON *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"top-level type mismatch",
             (allocator<char> *)
             ((long)&b.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  check_schema((JSON *)local_60,(JSON *)local_18,0,false,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&b.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "\n{\n  \"one\": {\n    \"a\": {\n      \"t\": \"oops\",\n      \"r\": [\n        \"x\",\n        \"ecks\",\n        \"y\",\n        \"why\"\n      ],\n      \"s\": {\n        \"z\": \"esses\"\n      }\n    }\n  },\n  \"two\": [\n    {\n      \"goose\": \"0 gander\",\n      \"glarp\": \"0 enspliel\"\n    },\n    {\n      \"goose\": \"1 gander\",\n      \"flarp\": \"1 enspliel\"\n    },\n    2,\n    [\n      \"three\"\n    ],\n    {\n      \"goose\": \"4 gander\",\n      \"glarp\": 4\n    }\n  ],\n  \"three\": {\n    \"anything\": {\n      \"x\": \"oops\",\n      \"o\": \"okay\"\n    },\n    \"else\": {\n      \"z\": \"okay\"\n    }\n  },\n  \"four\": [\n    {\"first\": \"missing second\"}\n  ]\n}\n"
             ,&local_e1);
  JSON::parse((JSON *)local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"missing items",
             (allocator<char> *)
             ((long)&bad_schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  check_schema((JSON *)local_c0,(JSON *)local_18,0,false,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bad_schema.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"{\"a\": true, \"b\": \"potato?\"}",&local_141);
  JSON::parse((JSON *)local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"bad schema field type",
             (allocator<char> *)
             ((long)&c.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  check_schema((JSON *)local_120,(JSON *)local_120,0,false,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "\n{\n  \"four\": [\n    { \"first\": 1 },\n    { \"oops\": [2] }\n  ]\n}\n",&local_1a1
            );
  JSON::parse((JSON *)local_180,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"array element mismatch",
             (allocator<char> *)
             ((long)&good.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  check_schema((JSON *)local_180,(JSON *)local_18,1,false,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&good.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "\n{\n  \"one\": {\n    \"a\": {\n      \"q\": \"potato\",\n      \"r\": {\n        \"x\": [1, null]\n      },\n      \"s\": [\n        {\"ss\": null},\n        {\"ss\": \"anything\"}\n      ]\n    }\n  },\n  \"two\": {\n    \"glarp\": \"enspliel\",\n    \"goose\": 3.14\n  },\n  \"three\": {\n    \"<objid>\": {\n      \"z\": \"ebra\"\n    }\n  },\n  \"four\": [\n    { \"first\": 1 },\n    { \"second\": [2] }\n  ]\n}\n"
             ,&local_201);
  JSON::parse((JSON *)local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"not optional",&local_229)
  ;
  check_schema((JSON *)local_1e0,(JSON *)local_18,0,false,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"pass",&local_251);
  check_schema((JSON *)local_1e0,(JSON *)local_18,1,true,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  JSON::~JSON((JSON *)local_1e0);
  JSON::~JSON((JSON *)local_180);
  JSON::~JSON((JSON *)local_120);
  JSON::~JSON((JSON *)local_c0);
  JSON::~JSON((JSON *)local_60);
  JSON::~JSON((JSON *)local_18);
  return;
}

Assistant:

static void
test_schema()
{
    /* cSpell: ignore ptional ebra */
    JSON schema = JSON::parse(R"(
{
  "one": {
    "a": {
      "q": "queue",
      "r": {
        "x": "ecks"
      },
      "s": [
        {
          "ss": "esses"
        }
      ]
    }
  },
  "two": [
    {
      "goose": "gander",
      "glarp": "enspliel"
    }
  ],
  "three": {
    "<objid>": {
      "z": "ebra",
      "o": "ptional"
    }
  },
  "four": [
    { "first": "first element" },
    { "second": "second element" }
  ]
}
)");

    JSON a = JSON::parse(R"(["not a", "dictionary"])");
    check_schema(a, schema, 0, false, "top-level type mismatch");
    JSON b = JSON::parse(R"(
{
  "one": {
    "a": {
      "t": "oops",
      "r": [
        "x",
        "ecks",
        "y",
        "why"
      ],
      "s": {
        "z": "esses"
      }
    }
  },
  "two": [
    {
      "goose": "0 gander",
      "glarp": "0 enspliel"
    },
    {
      "goose": "1 gander",
      "flarp": "1 enspliel"
    },
    2,
    [
      "three"
    ],
    {
      "goose": "4 gander",
      "glarp": 4
    }
  ],
  "three": {
    "anything": {
      "x": "oops",
      "o": "okay"
    },
    "else": {
      "z": "okay"
    }
  },
  "four": [
    {"first": "missing second"}
  ]
}
)");

    check_schema(b, schema, 0, false, "missing items");

    JSON bad_schema = JSON::parse(R"({"a": true, "b": "potato?"})");
    check_schema(bad_schema, bad_schema, 0, false, "bad schema field type");

    JSON c = JSON::parse(R"(
{
  "four": [
    { "first": 1 },
    { "oops": [2] }
  ]
}
)");
    check_schema(c, schema, JSON::f_optional, false, "array element mismatch");

    // "two" exercises the case of the JSON containing a single
    // element where the schema has an array.
    JSON good = JSON::parse(R"(
{
  "one": {
    "a": {
      "q": "potato",
      "r": {
        "x": [1, null]
      },
      "s": [
        {"ss": null},
        {"ss": "anything"}
      ]
    }
  },
  "two": {
    "glarp": "enspliel",
    "goose": 3.14
  },
  "three": {
    "<objid>": {
      "z": "ebra"
    }
  },
  "four": [
    { "first": 1 },
    { "second": [2] }
  ]
}
)");
    check_schema(good, schema, 0, false, "not optional");
    check_schema(good, schema, JSON::f_optional, true, "pass");
}